

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

RuleBasedBreakIterator * __thiscall
icu_63::RuleBasedBreakIterator::operator=(RuleBasedBreakIterator *this,RuleBasedBreakIterator *that)

{
  int iVar1;
  undefined4 extraout_var;
  RBBIDataWrapper *pRVar2;
  UErrorCode local_24;
  RuleBasedBreakIterator *pRStack_20;
  UErrorCode status;
  RuleBasedBreakIterator *that_local;
  RuleBasedBreakIterator *this_local;
  
  if (this != that) {
    pRStack_20 = that;
    that_local = this;
    BreakIterator::operator=(&this->super_BreakIterator,&that->super_BreakIterator);
    if (this->fLanguageBreakEngines != (UStack *)0x0) {
      if (this->fLanguageBreakEngines != (UStack *)0x0) {
        (*(this->fLanguageBreakEngines->super_UVector).super_UObject._vptr_UObject[1])();
      }
      this->fLanguageBreakEngines = (UStack *)0x0;
    }
    local_24 = U_ZERO_ERROR;
    utext_clone_63(&this->fText,&pRStack_20->fText,'\0','\x01',&local_24);
    if (((StringCharacterIterator *)this->fCharIter != &this->fSCharIter) &&
       (this->fCharIter != (CharacterIterator *)0x0)) {
      (*(this->fCharIter->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
    }
    this->fCharIter = (CharacterIterator *)&this->fSCharIter;
    if ((pRStack_20->fCharIter != (CharacterIterator *)0x0) &&
       ((StringCharacterIterator *)pRStack_20->fCharIter != &pRStack_20->fSCharIter)) {
      iVar1 = (*(pRStack_20->fCharIter->super_ForwardCharacterIterator).super_UObject._vptr_UObject
                [8])();
      this->fCharIter = (CharacterIterator *)CONCAT44(extraout_var,iVar1);
    }
    StringCharacterIterator::operator=(&this->fSCharIter,&pRStack_20->fSCharIter);
    if (this->fCharIter == (CharacterIterator *)0x0) {
      this->fCharIter = (CharacterIterator *)&this->fSCharIter;
    }
    if (this->fData != (RBBIDataWrapper *)0x0) {
      RBBIDataWrapper::removeReference(this->fData);
      this->fData = (RBBIDataWrapper *)0x0;
    }
    if (pRStack_20->fData != (RBBIDataWrapper *)0x0) {
      pRVar2 = RBBIDataWrapper::addReference(pRStack_20->fData);
      this->fData = pRVar2;
    }
    this->fPosition = pRStack_20->fPosition;
    this->fRuleStatusIndex = pRStack_20->fRuleStatusIndex;
    this->fDone = pRStack_20->fDone;
    BreakCache::reset(this->fBreakCache,this->fPosition,this->fRuleStatusIndex);
    DictionaryCache::reset(this->fDictionaryCache);
  }
  return this;
}

Assistant:

RuleBasedBreakIterator&
RuleBasedBreakIterator::operator=(const RuleBasedBreakIterator& that) {
    if (this == &that) {
        return *this;
    }
    BreakIterator::operator=(that);

    if (fLanguageBreakEngines != NULL) {
        delete fLanguageBreakEngines;
        fLanguageBreakEngines = NULL;   // Just rebuild for now
    }
    // TODO: clone fLanguageBreakEngines from "that"
    UErrorCode status = U_ZERO_ERROR;
    utext_clone(&fText, &that.fText, FALSE, TRUE, &status);

    if (fCharIter != &fSCharIter) {
        delete fCharIter;
    }
    fCharIter = &fSCharIter;

    if (that.fCharIter != NULL && that.fCharIter != &that.fSCharIter) {
        // This is a little bit tricky - it will intially appear that
        //  this->fCharIter is adopted, even if that->fCharIter was
        //  not adopted.  That's ok.
        fCharIter = that.fCharIter->clone();
    }
    fSCharIter = that.fSCharIter;
    if (fCharIter == NULL) {
        fCharIter = &fSCharIter;
    }

    if (fData != NULL) {
        fData->removeReference();
        fData = NULL;
    }
    if (that.fData != NULL) {
        fData = that.fData->addReference();
    }

    fPosition = that.fPosition;
    fRuleStatusIndex = that.fRuleStatusIndex;
    fDone = that.fDone;

    // TODO: both the dictionary and the main cache need to be copied.
    //       Current position could be within a dictionary range. Trying to continue
    //       the iteration without the caches present would go to the rules, with
    //       the assumption that the current position is on a rule boundary.
    fBreakCache->reset(fPosition, fRuleStatusIndex);
    fDictionaryCache->reset();

    return *this;
}